

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeC.cpp
# Opt level: O0

longlong SoapySDR_timeNsToTicks(longlong timeNs,double rate)

{
  longlong lVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double frac;
  double part;
  longlong err;
  longlong full;
  longlong ratell;
  
  lVar1 = llround((double)(in_RDI / 1000000000) * (in_XMM0_Qa - (double)(long)in_XMM0_Qa) +
                  ((double)(in_RDI % 1000000000) * in_XMM0_Qa) / 1000000000.0);
  return (in_RDI / 1000000000) * (long)in_XMM0_Qa + lVar1;
}

Assistant:

long long SoapySDR_timeNsToTicks(const long long timeNs, const double rate)
{
    const long long ratell = (long long)(rate);
    const long long full = (long long)(timeNs/1000000000);
    const long long err = timeNs - (full*1000000000);
    const double part = full*(rate - ratell);
    const double frac = part + ((err*rate)/1000000000);
    return (full*ratell) + llround(frac);
}